

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_formatter.cpp
# Opt level: O1

string * lwlog::details::alignment_formatter::align_center
                   (string *__return_storage_ptr__,string *to_align,uint8_t width,char fill_char)

{
  ulong uVar1;
  pointer pcVar2;
  char cVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = CONCAT71(in_register_00000011,width) & 0xffffffff;
  uVar1 = to_align->_M_string_length;
  uVar5 = uVar4 - uVar1;
  if (uVar4 < uVar1 || uVar5 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (to_align->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1,
               CONCAT71(in_register_00000009,fill_char));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    cVar3 = (char)(uVar5 >> 1);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,cVar3);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(to_align->_M_dataplus)._M_p);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
               (char)uVar5 - cVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string alignment_formatter::align_center(const std::string& to_align, std::uint8_t width, char fill_char)
	{
		if (width <= to_align.size()) return to_align;

		const auto total_padding{ width - to_align.size()		};
		const auto padding_left	{ total_padding / 2				};
		const auto padding_right{ total_padding - padding_left	};

		std::string result;
		result.reserve(width);

		result.append(padding_left, fill_char);
		result.append(to_align);
		result.append(padding_right, fill_char);

		return result;
	}